

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetRelErrFunc(void *kinmem,realtype relfunc)

{
  double __x;
  int iVar1;
  int error_code;
  char *msgfmt;
  double dVar2;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    error_code = -1;
  }
  else {
    dVar2 = 0.0;
    if (0.0 <= relfunc) {
      if ((relfunc != 0.0) || (NAN(relfunc))) {
        if (relfunc < 0.0) {
          dVar2 = sqrt(relfunc);
        }
        else {
          dVar2 = SQRT(relfunc);
        }
        *(double *)((long)kinmem + 0x80) = dVar2;
      }
      else {
        __x = *kinmem;
        if (0.0 < __x) {
          if (__x < 0.0) {
            dVar2 = sqrt(__x);
          }
          else {
            dVar2 = SQRT(__x);
          }
        }
        *(double *)((long)kinmem + 0x80) = dVar2;
      }
      return 0;
    }
    msgfmt = "relfunc < 0 illegal.";
    iVar1 = -2;
    error_code = -2;
  }
  KINProcessError((KINMem)0x0,error_code,"KINSOL","KINSetRelErrFunc",msgfmt);
  return iVar1;
}

Assistant:

int KINSetRelErrFunc(void *kinmem, realtype relfunc)
{
  KINMem kin_mem;
  realtype uround;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetRelErrFunc", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  if (relfunc < ZERO) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetRelErrFunc", MSG_BAD_RELFUNC);
    return(KIN_ILL_INPUT);
  }

  if (relfunc == ZERO) {
    uround = kin_mem->kin_uround;
    kin_mem->kin_sqrt_relfunc = SUNRsqrt(uround);
  } else {
    kin_mem->kin_sqrt_relfunc = SUNRsqrt(relfunc);
  }

  return(KIN_SUCCESS);
}